

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::plot
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,char *filename)

{
  long lVar1;
  ostream *poVar2;
  pointer pvVar3;
  size_t j;
  long lVar4;
  size_t i;
  long lVar5;
  char *local_3d8 [4];
  stringstream gnuplot_script;
  ostream local_3a8 [376];
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::__cxx11::stringstream::stringstream((stringstream *)&gnuplot_script);
  poVar2 = std::operator<<(local_3a8,filename);
  std::operator<<(poVar2,"_GnuplotScript");
  std::__cxx11::stringbuf::str();
  std::ofstream::open((char *)&out,(_Ios_Openmode)local_3d8[0]);
  std::__cxx11::string::~string((string *)local_3d8);
  poVar2 = std::operator<<((ostream *)&out,"plot      \'-\' matrix with image");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar5 = 0;
  while( true ) {
    pvVar3 = (this->heat_map).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (lVar5 == ((long)(this->heat_map).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) break;
    for (lVar4 = 0;
        lVar1 = *(long *)&pvVar3[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data,
        lVar4 != (long)*(pointer *)
                        ((long)&pvVar3[lVar5].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) - lVar1 >> 3; lVar4 = lVar4 + 1
        ) {
      poVar2 = std::ostream::_M_insert<double>(*(double *)(lVar1 + lVar4 * 8));
      std::operator<<(poVar2," ");
      pvVar3 = (this->heat_map).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&out);
    lVar5 = lVar5 + 1;
  }
  std::ofstream::close();
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
                          );
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(poVar2,local_3d8[0]);
  poVar2 = std::operator<<(poVar2,"\'\"");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gnuplot_script);
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::plot(const char* filename) const {
  std::ofstream out;
  std::stringstream gnuplot_script;
  gnuplot_script << filename << "_GnuplotScript";

  out.open(gnuplot_script.str().c_str());
  out << "plot      '-' matrix with image" << std::endl;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      out << this->heat_map[i][j] << " ";
    }
    out << std::endl;
  }
  out.close();
  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
}